

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

void __thiscall
winmd::reader::RetTypeSig::RetTypeSig(RetTypeSig *this,table_base *table,byte_view *data)

{
  bool bVar1;
  uint32_t uVar2;
  byte_view cursor;
  table_base *local_30;
  byte_view local_28;
  
  local_30 = table;
  parse_cmods(&this->m_cmod,table,data);
  bVar1 = is_by_ref(data);
  this->m_byref = bVar1;
  (this->m_type).super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
  super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
  super__Optional_payload_base<winmd::reader::TypeSig>._M_engaged = false;
  local_28.m_first = data->m_first;
  local_28.m_last = data->m_last;
  uVar2 = uncompress_unsigned(&local_28);
  if ((char)uVar2 == '\x01') {
    data->m_first = local_28.m_first;
    data->m_last = local_28.m_last;
  }
  else {
    std::optional<winmd::reader::TypeSig>::
    emplace<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
              (&this->m_type,&local_30,data);
  }
  return;
}

Assistant:

RetTypeSig(table_base const* table, byte_view& data)
            : m_cmod(parse_cmods(table, data))
            , m_byref(is_by_ref(data))
        {
            auto cursor = data;
            auto element_type = uncompress_enum<ElementType>(cursor);
            if (element_type == ElementType::Void)
            {
                data = cursor;
            }
            else
            {
                m_type.emplace(table, data);
            }
        }